

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O1

double discrete_mean(int a,double *b)

{
  ulong uVar1;
  ulong uVar2;
  double dVar3;
  double dVar4;
  
  dVar3 = r8vec_sum(a,b);
  if (a < 1) {
    dVar4 = 0.0;
  }
  else {
    dVar4 = 0.0;
    uVar2 = 0;
    do {
      uVar1 = uVar2 + 1;
      dVar4 = dVar4 + (double)(int)uVar1 * b[uVar2];
      uVar2 = uVar1;
    } while ((uint)a != uVar1);
  }
  return dVar4 / dVar3;
}

Assistant:

double discrete_mean ( int a, double b[] )

//****************************************************************************80
//
//  Purpose:
//
//    DISCRETE_MEAN evaluates the mean of the Discrete PDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    15 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int A, the number of probabilities assigned.
//
//    Input, double B[A], the relative probabilities of
//    outcomes 1 through A.  Each entry must be nonnegative.
//
//    Output, double DISCRETE_MEAN, the mean of the PDF.
//
{
  double b_sum;
  int j;
  double mean;

  b_sum = r8vec_sum ( a, b );

  mean = 0.0;
  for ( j = 0; j < a; j++ )
  {
    mean = mean + static_cast<double>(j + 1 ) * b[j];
  }

  mean = mean / b_sum;

  return mean;
}